

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::insertData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLCh *dat)

{
  XMLCh *pXVar1;
  XMLSize_t XVar2;
  int iVar3;
  DOMNodeImpl *pDVar4;
  XMLSize_t maxChars;
  XMLCh *target;
  undefined4 extraout_var;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  DOMRangeImpl *this_01;
  DOMException *this_02;
  long **pplVar6;
  ulong uVar7;
  XMLSize_t i;
  XMLSize_t getAt;
  XMLCh temp [4096];
  long lVar5;
  
  pDVar4 = castToNodeImpl(node);
  if ((pDVar4->flags & 1) == 0) {
    uVar7 = this->fDataBuf->fIndex;
    if (offset <= uVar7) {
      maxChars = XMLString::stringLen(dat);
      uVar7 = uVar7 + maxChars;
      if (uVar7 < 0xfff) {
        target = temp;
      }
      else {
        target = (XMLCh *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                                    (XMLPlatformUtils::fgMemoryManager,uVar7 * 2 + 2);
      }
      pXVar1 = this->fDataBuf->fBuffer;
      pXVar1[this->fDataBuf->fIndex] = L'\0';
      XMLString::copyNString(target,pXVar1,offset);
      XMLString::copyNString(target + offset,dat,maxChars);
      pXVar1 = this->fDataBuf->fBuffer;
      pXVar1[this->fDataBuf->fIndex] = L'\0';
      XMLString::copyString(target + offset + maxChars,pXVar1 + offset);
      DOMBuffer::set(this->fDataBuf,target);
      if (0xffe < uVar7) {
        (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x20))
                  (XMLPlatformUtils::fgMemoryManager,target);
      }
      iVar3 = (*node->_vptr_DOMNode[0xc])(node);
      lVar5 = CONCAT44(extraout_var,iVar3);
      if (lVar5 != 0) {
        this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)
                  (**(code **)(*(long *)(lVar5 + -8) + 0x230))(lVar5 + -8);
        if ((this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
           (XVar2 = this_00->fCurCount, XVar2 != 0)) {
          for (getAt = 0; XVar2 != getAt; getAt = getAt + 1) {
            this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,getAt);
            DOMRangeImpl::updateRangeForInsertedText(this_01,node,offset,maxChars);
          }
        }
      }
      return;
    }
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      pplVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pplVar6 = (long **)&this->fDoc->fMemoryManager;
    }
    DOMException::DOMException(this_02,1,0,(MemoryManager *)*pplVar6);
  }
  else {
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      pplVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pplVar6 = (long **)&this->fDoc->fMemoryManager;
    }
    DOMException::DOMException(this_02,7,0,(MemoryManager *)*pplVar6);
  }
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::insertData(const DOMNode *node, XMLSize_t offset, const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //

    XMLSize_t len = fDataBuf->getLen();
    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    XMLSize_t datLen = XMLString::stringLen(dat);

    XMLSize_t newLen = len + datLen;

    XMLCh* newString;
    XMLCh temp[4096];
    if (newLen >= 4095)
        newString = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
        (
            (newLen + 1) * sizeof(XMLCh)
        );//new XMLCh[newLen+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer(), offset);
    XMLString::copyNString(newString+offset, dat, datLen);
    XMLString::copyString(newString+offset+datLen, fDataBuf->getRawBuffer()+offset);

    fDataBuf->set(newString);

    if (newLen >= 4095)
        XMLPlatformUtils::fgMemoryManager->deallocate(newString);//delete[] newString;

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();
    if (doc != 0) {
        Ranges* ranges = doc->getRanges();
        if (ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedText( (DOMNode*)node, offset, datLen);
                }
            }
        }
    }
}